

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldInfo
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Descriptor *pDVar1;
  pointer *ppbVar2;
  size_type sVar3;
  long lVar4;
  GeneratorOptions *options_00;
  Printer *pPVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  string *value1;
  size_type *psVar11;
  Descriptor *pDVar12;
  pointer pbVar13;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *field_00;
  long lVar14;
  long lVar15;
  ulong uVar16;
  OneofDescriptor *pOVar17;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  GeneratorOptions *local_128;
  string local_120;
  string local_100;
  GeneratorOptions *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  string local_b0;
  string local_90;
  Printer *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_entries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneof_fields;
  
  value1 = (string *)desc;
  bVar7 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,(Descriptor *)options);
  local_128 = (GeneratorOptions *)desc;
  local_e0 = options;
  local_70 = printer;
  if (bVar7) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)value1);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,".repeatedFields_","");
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < *(int *)(desc + 0x2c)) {
      lVar14 = 0;
      lVar15 = 0;
      do {
        sVar3 = (((GeneratorOptions *)desc)->namespace_prefix).field_2._M_allocated_capacity;
        if ((*(int *)(sVar3 + 0x4c + lVar14) == 3) &&
           (bVar7 = FieldDescriptor::is_map((FieldDescriptor *)(sVar3 + lVar14)), !bVar7)) {
          (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                    ((string *)local_148,
                     (_anonymous_namespace_ *)
                     ((local_128->namespace_prefix).field_2._M_allocated_capacity + lVar14),field);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&numbers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148)
          ;
          if ((Descriptor *)local_148._0_8_ != (Descriptor *)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
          }
        }
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0xa8;
        desc = (Descriptor *)local_128;
      } while (lVar15 < *(int *)((long)&(local_128->namespace_prefix)._M_string_length + 4));
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_100,(protobuf *)&numbers,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x361833,(char *)value1);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x3b5350);
    options = local_e0;
    pDVar12 = (Descriptor *)(plVar9 + 2);
    if ((Descriptor *)*plVar9 == pDVar12) {
      local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
      local_138._8_8_ = plVar9[3];
      local_148._0_8_ = (Descriptor *)(local_148 + 0x10);
    }
    else {
      local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
      local_148._0_8_ = (Descriptor *)*plVar9;
    }
    local_148._8_8_ = plVar9[1];
    *plVar9 = (long)pDVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_148);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_120.field_2._M_allocated_capacity = *psVar11;
      local_120.field_2._8_8_ = plVar9[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar11;
      local_120._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_120._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((Descriptor *)local_148._0_8_ != (Descriptor *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
    }
    pPVar5 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&numbers);
    value1 = &local_90;
    io::Printer::Print(pPVar5,
                       "/**\n * List of repeated fields within this message type.\n * @private {!Array<number>}\n * @const\n */\n$classname$$rptfieldarray$ = $rptfields$;\n\n"
                       ,"classname",value1,"rptfieldarray",&local_b0,"rptfields",&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    desc = (Descriptor *)local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  uVar10 = (ulong)*(int *)((long)&(((GeneratorOptions *)desc)->namespace_prefix)._M_string_length +
                          4);
  pDVar12 = (Descriptor *)CONCAT71((int7)((ulong)value1 >> 8),0 < (long)uVar10);
  if (0 < (long)uVar10) {
    pDVar12 = (Descriptor *)
              (((GeneratorOptions *)desc)->namespace_prefix).field_2._M_allocated_capacity;
    if (*(long *)(pDVar12 + 0x60) != 0) goto LAB_00220f37;
    pDVar12 = pDVar12 + 0x108;
    uVar6 = 1;
    do {
      uVar16 = uVar6;
      if (uVar10 == uVar16) break;
      lVar14 = *(long *)pDVar12;
      pDVar12 = pDVar12 + 0xa8;
      uVar6 = uVar16 + 1;
    } while (lVar14 == 0);
    pDVar12 = (Descriptor *)CONCAT71((int7)((ulong)pDVar12 >> 8),uVar16 < uVar10);
  }
  if ((char)pDVar12 == '\0') {
    return;
  }
LAB_00220f37:
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,pDVar12);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,".oneofGroups_","");
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oneof_entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1 = (Descriptor *)(local_148 + 0x10);
  if (0 < *(int *)((long)&(((GeneratorOptions *)desc)->namespace_prefix).field_2 + 8)) {
    lVar14 = 0;
    do {
      pOVar17 = (OneofDescriptor *)(lVar14 * 0x30 + *(long *)&((GeneratorOptions *)desc)->binary);
      bVar7 = anon_unknown_0::IgnoreOneof(pOVar17);
      if (!bVar7) {
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        oneof_fields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < *(int *)(pOVar17 + 0x1c)) {
          lVar15 = 0;
          field_00 = extraout_RDX;
          do {
            lVar4 = *(long *)(*(long *)(pOVar17 + 0x20) + lVar15 * 8);
            if ((*(char *)(lVar4 + 0x50) != '\x01') ||
               (iVar8 = std::__cxx11::string::compare
                                  ((char *)**(undefined8 **)(*(long *)(lVar4 + 0x58) + 0x10)),
               field_00 = extraout_RDX_00, iVar8 != 0)) {
              (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                        ((string *)local_148,
                         *(_anonymous_namespace_ **)(*(long *)(pOVar17 + 0x20) + lVar15 * 8),
                         field_00);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &oneof_fields,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148);
              field_00 = extraout_RDX_01;
              if ((Descriptor *)local_148._0_8_ != pDVar1) {
                operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
                field_00 = extraout_RDX_02;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)(pOVar17 + 0x1c));
        }
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_90,(protobuf *)&oneof_fields,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x361833,(char *)pDVar12);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x3b5350);
        desc = (Descriptor *)local_128;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100.field_2._8_8_ = plVar9[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar11;
          local_100._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_100._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
        pDVar12 = (Descriptor *)(plVar9 + 2);
        if ((Descriptor *)*plVar9 == pDVar12) {
          local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
          local_138._8_8_ = plVar9[3];
          local_148._0_8_ = pDVar1;
        }
        else {
          local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
          local_148._0_8_ = (Descriptor *)*plVar9;
        }
        local_148._8_8_ = plVar9[1];
        *plVar9 = (long)pDVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &oneof_entries,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
        if ((Descriptor *)local_148._0_8_ != pDVar1) {
          operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&oneof_fields);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < *(int *)((long)&(((GeneratorOptions *)desc)->namespace_prefix).field_2 + 8));
  }
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_100,(protobuf *)&oneof_entries,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x361833,(char *)pDVar12);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x3b5350);
  options_00 = local_e0;
  pDVar12 = (Descriptor *)(plVar9 + 2);
  if ((Descriptor *)*plVar9 == pDVar12) {
    local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
    local_138._8_8_ = plVar9[3];
    local_148._0_8_ = pDVar1;
  }
  else {
    local_138._M_allocated_capacity = *(undefined8 *)pDVar12;
    local_148._0_8_ = (Descriptor *)*plVar9;
  }
  local_148._8_8_ = plVar9[1];
  *plVar9 = (long)pDVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_148);
  ppbVar2 = &numbers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar13 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pbVar13) {
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
  }
  else {
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar13->_M_dataplus)._M_p;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
  }
  numbers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
  *plVar9 = (long)pbVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((Descriptor *)local_148._0_8_ != pDVar1) {
    operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
  }
  pPVar5 = local_70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&oneof_entries);
  io::Printer::Print(pPVar5,
                     "/**\n * Oneof group definitions for this message. Each group defines the field\n * numbers belonging to that group. When of these fields\' value is set, all\n * other fields in the group are cleared. During deserialization, if multiple\n * fields are encountered for a group, only the last value seen will be kept.\n * @private {!Array<!Array<number>>}\n * @const\n */\n$classname$$oneofgrouparray$ = $oneofgroups$;\n\n"
                     ,"classname",&local_b0,"oneofgrouparray",&local_120,"oneofgroups",
                     (string *)&numbers);
  if (numbers.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
    operator_delete(numbers.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((numbers.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)&(((GeneratorOptions *)desc)->namespace_prefix).field_2 + 8)) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pOVar17 = (OneofDescriptor *)(*(long *)&((GeneratorOptions *)desc)->binary + lVar14);
      bVar7 = anon_unknown_0::IgnoreOneof(pOVar17);
      if (!bVar7) {
        GenerateOneofCaseDefinition
                  ((Generator *)pOVar17,options_00,pPVar5,
                   (OneofDescriptor *)(*(long *)&((GeneratorOptions *)desc)->binary + lVar14));
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x30;
    } while (lVar15 < *(int *)((long)&(((GeneratorOptions *)desc)->namespace_prefix).field_2 + 8));
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldInfo(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc) const {
  if (HasRepeatedFields(options, desc)) {
    printer->Print(
        "/**\n"
        " * List of repeated fields within this message type.\n"
        " * @private {!Array<number>}\n"
        " * @const\n"
        " */\n"
        "$classname$$rptfieldarray$ = $rptfields$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "rptfieldarray", kRepeatedFieldArrayName,
        "rptfields", RepeatedFieldNumberList(options, desc));
  }

  if (HasOneofFields(desc)) {
    printer->Print(
        "/**\n"
        " * Oneof group definitions for this message. Each group defines the "
        "field\n"
        " * numbers belonging to that group. When of these fields' value is "
        "set, all\n"
        " * other fields in the group are cleared. During deserialization, if "
        "multiple\n"
        " * fields are encountered for a group, only the last value seen will "
        "be kept.\n"
        " * @private {!Array<!Array<number>>}\n"
        " * @const\n"
        " */\n"
        "$classname$$oneofgrouparray$ = $oneofgroups$;\n"
        "\n",
        "classname", GetMessagePath(options, desc),
        "oneofgrouparray", kOneofGroupArrayName,
        "oneofgroups", OneofGroupList(desc));

    for (int i = 0; i < desc->oneof_decl_count(); i++) {
      if (IgnoreOneof(desc->oneof_decl(i))) {
        continue;
      }
      GenerateOneofCaseDefinition(options, printer, desc->oneof_decl(i));
    }
  }
}